

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VtabFinishParse(Parse *pParse,Token *pEnd)

{
  Table *data;
  sqlite3 *db;
  Schema *pSVar1;
  int *piVar2;
  undefined8 *puVar3;
  uint N;
  int iVar4;
  long *plVar5;
  void *pvVar6;
  Parse *pPVar7;
  char *pcVar8;
  Vdbe *p;
  char *pcVar9;
  HashElem *pHVar10;
  int iDest;
  
  data = pParse->pNewTable;
  if (data != (Table *)0x0) {
    db = pParse->db;
    addArgumentToVtab(pParse);
    (pParse->sArg).z = (char *)0x0;
    if (0 < (data->u).tab.addColOffset) {
      if ((db->init).busy == '\0') {
        pPVar7 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar7 = pParse;
        }
        pPVar7->mayAbort = '\x01';
        if (pEnd != (Token *)0x0) {
          (pParse->sNameToken).n = (*(int *)&pEnd->z - *(int *)&(pParse->sNameToken).z) + pEnd->n;
        }
        pcVar8 = sqlite3MPrintf(db,"CREATE VIRTUAL TABLE %T",&pParse->sNameToken);
        iVar4 = sqlite3SchemaToIndex(db,data->pSchema);
        sqlite3NestedParse(pParse,
                           "UPDATE %Q.sqlite_master SET type=\'table\', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q WHERE rowid=#%d"
                           ,db->aDb[iVar4].zDbSName,data->zName,data->zName,pcVar8,pParse->regRowid)
        ;
        p = sqlite3GetVdbe(pParse);
        sqlite3ChangeCookie(pParse,iVar4);
        sqlite3VdbeAddOp0(p,0xa6);
        pcVar9 = sqlite3MPrintf(db,"name=%Q AND sql=%Q",data->zName);
        sqlite3VdbeAddParseSchemaOp(p,iVar4,pcVar9,0);
        sqlite3DbFree(db,pcVar8);
        iDest = pParse->nMem + 1;
        pParse->nMem = iDest;
        sqlite3VdbeLoadString(p,iDest,data->zName);
        sqlite3VdbeAddOp2(p,0xab,iVar4,iDest);
        return;
      }
      pSVar1 = data->pSchema;
      pcVar8 = data->zName;
      plVar5 = (long *)sqlite3HashFind(&db->aModule,*(data->u).vtab.azArg);
      if ((((plVar5 != (long *)0x0) && (piVar2 = (int *)*plVar5, piVar2 != (int *)0x0)) &&
          (2 < *piVar2)) && (*(long *)(piVar2 + 0x2e) != 0)) {
        N = sqlite3Strlen30(data->zName);
        pHVar10 = (HashElem *)&(data->pSchema->tblHash).first;
        while (pHVar10 = pHVar10->next, pHVar10 != (HashElem *)0x0) {
          puVar3 = (undefined8 *)pHVar10->data;
          if ((*(char *)((long)puVar3 + 0x3f) == '\0') &&
             ((*(byte *)((long)puVar3 + 0x31) & 0x10) == 0)) {
            pcVar9 = (char *)*puVar3;
            iVar4 = sqlite3_strnicmp(pcVar9,data->zName,N);
            if ((iVar4 == 0) && (pcVar9[N] == '_')) {
              iVar4 = (**(code **)(*plVar5 + 0xb8))(pcVar9 + (ulong)N + 1);
              if (iVar4 != 0) {
                *(byte *)((long)puVar3 + 0x31) = *(byte *)((long)puVar3 + 0x31) | 0x10;
              }
            }
          }
        }
      }
      pvVar6 = sqlite3HashInsert(&pSVar1->tblHash,pcVar8,data);
      if (pvVar6 != (void *)0x0) {
        sqlite3OomFault(db);
        return;
      }
      pParse->pNewTable = (Table *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabFinishParse(Parse *pParse, Token *pEnd){
  Table *pTab = pParse->pNewTable;  /* The table being constructed */
  sqlite3 *db = pParse->db;         /* The database connection */

  if( pTab==0 ) return;
  assert( IsVirtual(pTab) );
  addArgumentToVtab(pParse);
  pParse->sArg.z = 0;
  if( pTab->u.vtab.nArg<1 ) return;

  /* If the CREATE VIRTUAL TABLE statement is being entered for the
  ** first time (in other words if the virtual table is actually being
  ** created now instead of just being read out of sqlite_schema) then
  ** do additional initialization work and store the statement text
  ** in the sqlite_schema table.
  */
  if( !db->init.busy ){
    char *zStmt;
    char *zWhere;
    int iDb;
    int iReg;
    Vdbe *v;

    sqlite3MayAbort(pParse);

    /* Compute the complete text of the CREATE VIRTUAL TABLE statement */
    if( pEnd ){
      pParse->sNameToken.n = (int)(pEnd->z - pParse->sNameToken.z) + pEnd->n;
    }
    zStmt = sqlite3MPrintf(db, "CREATE VIRTUAL TABLE %T", &pParse->sNameToken);

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    **
    ** The VM register number pParse->regRowid holds the rowid of an
    ** entry in the sqlite_schema table tht was created for this vtab
    ** by sqlite3StartTable().
    */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE " "
         "SET type='table', name=%Q, tbl_name=%Q, rootpage=0, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      pTab->zName,
      pTab->zName,
      zStmt,
      pParse->regRowid
    );
    v = sqlite3GetVdbe(pParse);
    sqlite3ChangeCookie(pParse, iDb);

    sqlite3VdbeAddOp0(v, OP_Expire);
    zWhere = sqlite3MPrintf(db, "name=%Q AND sql=%Q", pTab->zName, zStmt);
    sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere, 0);
    sqlite3DbFree(db, zStmt);

    iReg = ++pParse->nMem;
    sqlite3VdbeLoadString(v, iReg, pTab->zName);
    sqlite3VdbeAddOp2(v, OP_VCreate, iDb, iReg);
  }else{
    /* If we are rereading the sqlite_schema table create the in-memory
    ** record of the table. */
    Table *pOld;
    Schema *pSchema = pTab->pSchema;
    const char *zName = pTab->zName;
    assert( zName!=0 );
    sqlite3MarkAllShadowTablesOf(db, pTab);
    pOld = sqlite3HashInsert(&pSchema->tblHash, zName, pTab);
    if( pOld ){
      sqlite3OomFault(db);
      assert( pTab==pOld );  /* Malloc must have failed inside HashInsert() */
      return;
    }
    pParse->pNewTable = 0;
  }
}